

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O1

Vec_Int_t * Glucose_SolverFromAig(Gia_Man_t *p,SimpSolver *s)

{
  vec<Gluco::Lit> *this;
  long lVar1;
  vec<Gluco::Lit> *ps;
  int iVar2;
  Cnf_Dat_t *p_00;
  Vec_Int_t *pVVar3;
  int *__dest;
  long lVar4;
  int level;
  int *piVar5;
  timespec ts;
  timespec local_50;
  long local_40;
  vec<Gluco::Lit> *local_38;
  
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    local_40 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_40 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) +
               CONCAT44(local_50.tv_sec._4_4_,(int)local_50.tv_sec) * -1000000;
  }
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,1,0,0);
  if (0 < p_00->nClauses) {
    this = &(s->super_Solver).user_lits;
    local_38 = &(s->super_Solver).add_tmp;
    lVar4 = 0;
    do {
      if (this->data != (Lit *)0x0) {
        (s->super_Solver).user_lits.sz = 0;
      }
      piVar5 = p_00->pClauses[lVar4];
      lVar1 = lVar4 + 1;
      if (piVar5 < p_00->pClauses[lVar4 + 1]) {
        do {
          local_50.tv_sec._0_4_ = *piVar5;
          Gluco::vec<Gluco::Lit>::push(this,(Lit *)&local_50);
          iVar2 = *piVar5;
          while ((s->super_Solver).vardata.sz <= iVar2 >> 1) {
            Gluco::SimpSolver::newVar(s,true,true);
          }
          piVar5 = piVar5 + 1;
        } while (piVar5 < p_00->pClauses[lVar1]);
      }
      ps = local_38;
      Gluco::vec<Gluco::Lit>::copyTo(this,local_38);
      Gluco::SimpSolver::addClause_(s,ps);
      lVar4 = lVar1;
    } while (lVar1 < p_00->nClauses);
  }
  piVar5 = p_00->pVarNums;
  iVar2 = p_00->nVars;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nSize = iVar2;
  pVVar3->nCap = iVar2;
  __dest = (int *)malloc((long)iVar2 << 2);
  pVVar3->pArray = __dest;
  memcpy(__dest,piVar5,(long)iVar2 << 2);
  printf("CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ",(ulong)(uint)p_00->nVars,
         (ulong)(uint)p_00->nClauses,(ulong)(uint)p_00->nLiterals);
  level = 3;
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_50.tv_nsec / 1000 + CONCAT44(local_50.tv_sec._4_4_,(int)local_50.tv_sec) * 1000000
    ;
  }
  lVar4 = lVar4 + local_40;
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)lVar4 / 1000000.0);
  Cnf_DataFree(p_00);
  return pVVar3;
}

Assistant:

Vec_Int_t * Glucose_SolverFromAig( Gia_Man_t * p, SimpSolver& s )
{
    abctime clk = Abc_Clock();
    vec<Lit> * lits = &s.user_lits;
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8 /*nLutSize*/, 0 /*fCnfObjIds*/, 1/*fAddOrCla*/, 0, 0/*verbose*/ );
    for ( int i = 0; i < pCnf->nClauses; i++ )
    {
        lits->clear();
        for ( int * pLit = pCnf->pClauses[i]; pLit < pCnf->pClauses[i+1]; pLit++ )
            lits->push( toLit(*pLit) ), s.addVar( *pLit >> 1 );
        s.addClause(*lits);
    }
    Vec_Int_t * vCnfIds = Vec_IntAllocArrayCopy(pCnf->pVarNums,pCnf->nVars);
    printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Cnf_DataFree(pCnf);
    return vCnfIds;
}